

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O1

void gdImageSkewY(gdImagePtr dst,gdImagePtr src,int uCol,int iOffset,double dWeight,int clrBack,
                 int ignoretransparent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  byte bVar7;
  code *pcVar5;
  undefined8 uVar6;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int g;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int a;
  int b;
  int iVar18;
  
  if (src->trueColor == 0) {
    pcVar5 = gdImageGetPixel;
  }
  else {
    pcVar5 = gdImageGetTrueColorPixel;
  }
  if (-1 < iOffset) {
    iVar11 = 0;
    do {
      gdImageSetPixel(dst,uCol,iVar11,clrBack);
      iVar11 = iVar11 + 1;
    } while (iOffset + 1 != iVar11);
  }
  iVar11 = src->trueColor;
  if (iVar11 == 0) {
    uVar8 = src->red[clrBack];
  }
  else {
    uVar8 = (uint)clrBack >> 0x10 & 0xff;
  }
  if (iVar11 == 0) {
    uVar9 = src->green[clrBack];
  }
  else {
    uVar9 = (uint)clrBack >> 8 & 0xff;
  }
  if (iVar11 == 0) {
    uVar10 = src->blue[clrBack];
  }
  else {
    uVar10 = clrBack & 0xff;
  }
  if (iVar11 == 0) {
    uVar4 = src->alpha[clrBack];
  }
  else {
    uVar4 = (uint)clrBack >> 0x18 & 0x7f;
  }
  uVar8 = gdImageColorAllocateAlpha
                    (dst,(int)((double)(int)uVar8 * dWeight),(int)((double)(int)uVar9 * dWeight),
                     (int)((double)(int)uVar10 * dWeight),(int)((double)(int)uVar4 * dWeight));
  if (src->sy < 1) {
    iVar11 = 0;
    uVar8 = 0;
  }
  else {
    iVar11 = 0;
    do {
      uVar6 = (*pcVar5)(src,uCol,iVar11);
      iVar18 = src->trueColor;
      uVar10 = (uint)uVar6;
      uVar9 = (uint)((ulong)uVar6 >> 0x10);
      if (iVar18 == 0) {
        uVar4 = src->red[(int)uVar10];
      }
      else {
        uVar4 = uVar9 & 0xff;
      }
      bVar7 = (byte)((ulong)uVar6 >> 8);
      uVar17 = (uint)((ulong)uVar6 >> 0x18);
      if (iVar18 == 0) {
        uVar12 = src->green[(int)uVar10];
        uVar14 = src->blue[(int)uVar10];
        uVar15 = src->alpha[(int)uVar10];
      }
      else {
        uVar12 = (uint)bVar7;
        uVar14 = uVar10 & 0xff;
        uVar15 = uVar17 & 0x7f;
      }
      iVar13 = (int)((double)(int)uVar15 * dWeight);
      iVar1 = (int)((double)(int)uVar4 * dWeight);
      if (0xfe < (int)((double)(int)uVar4 * dWeight)) {
        iVar1 = 0xff;
      }
      iVar2 = (int)((double)(int)uVar12 * dWeight);
      if (0xfe < (int)((double)(int)uVar12 * dWeight)) {
        iVar2 = 0xff;
      }
      iVar3 = (int)((double)(int)uVar14 * dWeight);
      if (0xfe < (int)((double)(int)uVar14 * dWeight)) {
        iVar3 = 0xff;
      }
      if (0x7e < iVar13) {
        iVar13 = 0x7f;
      }
      if (iVar18 == 0) {
        uVar9 = src->red[(int)uVar10];
        uVar4 = src->red[(int)uVar8];
        uVar12 = src->green[(int)uVar10];
        uVar14 = src->green[(int)uVar8];
        uVar15 = src->blue[(int)uVar10];
        uVar16 = src->blue[(int)uVar8];
        uVar17 = src->alpha[(int)uVar10];
        uVar8 = src->alpha[(int)uVar8];
      }
      else {
        uVar9 = uVar9 & 0xff;
        uVar4 = uVar8 >> 0x10 & 0xff;
        uVar12 = (uint)bVar7;
        uVar14 = uVar8 >> 8 & 0xff;
        uVar15 = uVar10 & 0xff;
        uVar16 = uVar8 & 0xff;
        uVar17 = uVar17 & 0x7f;
        uVar8 = uVar8 >> 0x18 & 0x7f;
      }
      iVar18 = (uVar9 - iVar1) + uVar4;
      g = (uVar12 - iVar2) + uVar14;
      b = (uVar15 - iVar3) + uVar16;
      a = (uVar17 - iVar13) + uVar8;
      if (0xfe < iVar18) {
        iVar18 = 0xff;
      }
      if (0xfe < g) {
        g = 0xff;
      }
      if (0xfe < b) {
        b = 0xff;
      }
      if (0x7e < a) {
        a = 0x7f;
      }
      if (((ignoretransparent == 0) || (uVar8 = dst->transparent, uVar10 != uVar8)) &&
         (uVar8 = gdImageColorAllocateAlpha(dst,iVar18,g,b,a), uVar8 == 0xffffffff)) {
        uVar8 = gdImageColorClosestAlpha(dst,iVar18,g,b,a);
      }
      iVar18 = iOffset + iVar11;
      if ((-1 < iVar18) && (iVar18 < dst->sy)) {
        gdImageSetPixel(dst,uCol,iVar18,uVar8);
      }
      uVar8 = iVar2 * 0x100 + iVar3 + iVar1 * 0x10000 + iVar13 * 0x1000000;
      iVar11 = iVar11 + 1;
    } while (iVar11 < src->sy);
    iVar11 = iOffset + iVar11 + -1;
  }
  if (iVar11 < dst->sy) {
    gdImageSetPixel(dst,uCol,iVar11,uVar8);
  }
  if (iVar11 < dst->sy) {
    do {
      gdImageSetPixel(dst,uCol,iVar11,clrBack);
      iVar11 = iVar11 + 1;
    } while (iVar11 < dst->sy);
  }
  return;
}

Assistant:

void gdImageSkewY (gdImagePtr dst, gdImagePtr src, int uCol, int iOffset, double dWeight, int clrBack, int ignoretransparent)
{
	int i, iYPos=0, r, g, b, a;
	FuncPtr f;
	int pxlOldLeft, pxlLeft=0, pxlSrc;

	if (src->trueColor) {
		f = gdImageGetTrueColorPixel;
	} else {
		f = gdImageGetPixel;
	}

	for (i = 0; i<=iOffset; i++) {
		gdImageSetPixel (dst, uCol, i, clrBack);
	}
	r = (int)((double)gdImageRed(src,clrBack) * dWeight);
	g = (int)((double)gdImageGreen(src,clrBack) * dWeight);
	b = (int)((double)gdImageBlue(src,clrBack) * dWeight);
	a = (int)((double)gdImageAlpha(src,clrBack) * dWeight);

	pxlOldLeft = gdImageColorAllocateAlpha(dst, r, g, b, a);

	for (i = 0; i < src->sy; i++) {
		pxlSrc = f (src, uCol, i);
		iYPos = i + iOffset;

		r = (int)((double)gdImageRed(src,pxlSrc) * dWeight);
		g = (int)((double)gdImageGreen(src,pxlSrc) * dWeight);
		b = (int)((double)gdImageBlue(src,pxlSrc) * dWeight);
		a = (int)((double)gdImageAlpha(src,pxlSrc) * dWeight);

		if (r>255) {
        	r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
    			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		pxlLeft = gdTrueColorAlpha(r, g, b, a);

		r = gdImageRed(src,pxlSrc)   - (r - gdImageRed(src,pxlOldLeft));
		g = gdImageGreen(src,pxlSrc) - (g - gdImageGreen(src,pxlOldLeft));
		b = gdImageBlue(src,pxlSrc)  - (b - gdImageBlue(src,pxlOldLeft));
		a = gdImageAlpha(src,pxlSrc) - (a - gdImageAlpha(src,pxlOldLeft));

		if (r>255) {
        	r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
    			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		if (ignoretransparent && pxlSrc == dst->transparent) {
			pxlSrc = dst->transparent;
		} else {
			pxlSrc = gdImageColorAllocateAlpha(dst, r, g, b, a);

			if (pxlSrc == -1) {
				pxlSrc = gdImageColorClosestAlpha(dst, r, g, b, a);
			}
		}

		if ((iYPos >= 0) && (iYPos < dst->sy)) {
			gdImageSetPixel (dst, uCol, iYPos, pxlSrc);
		}

		pxlOldLeft = pxlLeft;
	}

	i = iYPos;
	if (i < dst->sy) {
		gdImageSetPixel (dst, uCol, i, pxlLeft);
	}

	i--;
	while (++i < dst->sy) {
		gdImageSetPixel (dst, uCol, i, clrBack);
	}
}